

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O0

ValueType * __thiscall
HighsHashTable<int,_int>::operator[](HighsHashTable<int,_int> *this,KeyType_conflict *key)

{
  ulong uVar1;
  bool bVar2;
  pointer args;
  type puVar3;
  ulong uVar4;
  u64 uVar5;
  u64 uVar6;
  HighsHashTable<int,_int> *in_RSI;
  HighsHashTable<int,_int> *in_RDI;
  u64 distanceOfCurrentOccupant;
  u64 currentDistance;
  Entry entry;
  ValueType *insertLocation;
  u8 meta;
  u64 maxPos;
  u64 startPos;
  u64 pos;
  Entry *entryArray;
  HighsHashTable<int,_int> *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  HighsHashTableEntry<int,_int> local_50;
  int *local_48;
  undefined7 in_stack_ffffffffffffffc0;
  uchar in_stack_ffffffffffffffc7;
  u64 *in_stack_ffffffffffffffc8;
  HighsHashTable<int,_int> *in_stack_ffffffffffffffd0;
  u64 *in_stack_ffffffffffffffd8;
  int *local_8;
  
  args = std::unique_ptr<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>::get
                   ((unique_ptr<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>
                     *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  bVar2 = findPosition(in_RSI,&args->key_,(u8 *)in_stack_ffffffffffffffd8,
                       (u64 *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                       (u64 *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  if (bVar2) {
    local_8 = HighsHashTableEntry<int,_int>::value(args + (long)in_stack_ffffffffffffffd8);
  }
  else if ((in_RDI->numElements == (in_RDI->tableSizeMask + 1) * 7 >> 3) ||
          (in_stack_ffffffffffffffd8 == in_stack_ffffffffffffffc8)) {
    growTable(in_stack_ffffffffffffffd0);
    local_8 = operator[](in_RSI,&args->key_);
  }
  else {
    local_48 = HighsHashTableEntry<int,_int>::value(args + (long)in_stack_ffffffffffffffd8);
    HighsHashTableEntry<int,_int>::HighsHashTableEntry<const_int_&,_0>(&local_50,(int *)in_RSI);
    in_RDI->numElements = in_RDI->numElements + 1;
    do {
      puVar3 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                          CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                          (size_t)in_stack_ffffffffffffff88);
      bVar2 = occupied(in_RDI,*puVar3);
      if (!bVar2) {
        puVar3 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffff90),
                            (size_t)in_stack_ffffffffffffff88);
        *puVar3 = in_stack_ffffffffffffffc7;
        args[(long)in_stack_ffffffffffffffd8] = local_50;
        return local_48;
      }
      uVar4 = (long)in_stack_ffffffffffffffd8 - (long)in_stack_ffffffffffffffd0;
      uVar1 = in_RDI->tableSizeMask;
      uVar5 = distanceFromIdealSlot
                        ((HighsHashTable<int,_int> *)
                         CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                         (u64)in_stack_ffffffffffffff88);
      if (uVar5 < (uVar4 & uVar1)) {
        std::swap<HighsHashTableEntry<int,int>>(&local_50,args + (long)in_stack_ffffffffffffffd8);
        puVar3 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                            (size_t)in_stack_ffffffffffffff88);
        std::swap<unsigned_char>(&stack0xffffffffffffffc7,puVar3);
        in_stack_ffffffffffffff88 =
             (HighsHashTable<int,_int> *)
             ((long)in_stack_ffffffffffffffd8 - uVar5 & in_RDI->tableSizeMask);
        in_stack_ffffffffffffffd0 = in_stack_ffffffffffffff88;
        uVar6 = maxDistance();
        in_stack_ffffffffffffffc8 =
             (u64 *)((long)&(in_stack_ffffffffffffff88->entries)._M_t.
                            super___uniq_ptr_impl<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_HighsHashTableEntry<int,_int>_*,_HighsHashTable<int,_int>::OpNewDeleter>
                            .super__Head_base<0UL,_HighsHashTableEntry<int,_int>_*,_false>.
                            _M_head_impl + uVar6 & in_RDI->tableSizeMask);
      }
      in_stack_ffffffffffffffd8 =
           (u64 *)((long)in_stack_ffffffffffffffd8 + 1U & in_RDI->tableSizeMask);
    } while (in_stack_ffffffffffffffd8 != in_stack_ffffffffffffffc8);
    growTable(in_stack_ffffffffffffffd0);
    HighsHashTable<int,int>::insert<HighsHashTableEntry<int,int>>(in_RSI,args);
    local_8 = operator[](in_RSI,&args->key_);
  }
  return local_8;
}

Assistant:

ValueType& operator[](const KeyType& key) {
    Entry* entryArray = entries.get();
    u64 pos, startPos, maxPos;
    u8 meta;
    if (findPosition(key, meta, startPos, maxPos, pos))
      return entryArray[pos].value();

    if (numElements == ((tableSizeMask + 1) * 7) / 8 || pos == maxPos) {
      growTable();
      return (*this)[key];
    }

    using std::swap;
    ValueType& insertLocation = entryArray[pos].value();
    Entry entry(key);
    ++numElements;

    do {
      if (!occupied(metadata[pos])) {
        metadata[pos] = meta;
        new (&entryArray[pos]) Entry{std::move(entry)};
        return insertLocation;
      }

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      u64 distanceOfCurrentOccupant = distanceFromIdealSlot(pos);
      if (currentDistance > distanceOfCurrentOccupant) {
        // steal the position
        swap(entry, entryArray[pos]);
        swap(meta, metadata[pos]);

        startPos = (pos - distanceOfCurrentOccupant) & tableSizeMask;
        maxPos = (startPos + maxDistance()) & tableSizeMask;
      }
      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    growTable();
    insert(std::move(entry));
    return (*this)[key];
  }